

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ArrayJoinPromiseNodeBase::Branch::Branch
          (Branch *this,ArrayJoinPromiseNodeBase *joinNode,Own<kj::_::PromiseNode> *dependencyParam,
          ExceptionOrValue *output)

{
  Own<kj::_::PromiseNode> *other;
  PromiseNode *pPVar1;
  ExceptionOrValue *output_local;
  Own<kj::_::PromiseNode> *dependencyParam_local;
  ArrayJoinPromiseNodeBase *joinNode_local;
  Branch *this_local;
  
  Event::Event(&this->super_Event);
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_005d2910;
  this->joinNode = joinNode;
  other = mv<kj::Own<kj::_::PromiseNode>>(dependencyParam);
  Own<kj::_::PromiseNode>::Own(&this->dependency,other);
  this->output = output;
  pPVar1 = Own<kj::_::PromiseNode>::operator->(&this->dependency);
  (*pPVar1->_vptr_PromiseNode[1])();
  pPVar1 = Own<kj::_::PromiseNode>::operator->(&this->dependency);
  (**pPVar1->_vptr_PromiseNode)(pPVar1,this);
  return;
}

Assistant:

ArrayJoinPromiseNodeBase::Branch::Branch(
    ArrayJoinPromiseNodeBase& joinNode, Own<PromiseNode> dependencyParam, ExceptionOrValue& output)
    : joinNode(joinNode), dependency(kj::mv(dependencyParam)), output(output) {
  dependency->setSelfPointer(&dependency);
  dependency->onReady(this);
}